

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O1

void Abc_NtkDumpEquiv(Abc_Ntk_t **pNtks,char *pFileName,int nConfs,int fByName,int fVerbose)

{
  Gia_Man_t *pGia;
  Gia_Man_t *pGVar1;
  Vec_Int_t *vClasses;
  
  pGia = Abc_NtkAigToGiaTwo(*pNtks,pNtks[1],fByName);
  if (fVerbose == 0) {
    pGVar1 = Gia_ManComputeGiaEquivs(pGia,nConfs,0);
    Gia_ManStop(pGVar1);
  }
  else {
    printf("Computing equivalences for networks \"%s\" and \"%s\" with conflict limit %d.\n",
           (*pNtks)->pName,pNtks[1]->pName,(ulong)(uint)nConfs);
    pGVar1 = Gia_ManComputeGiaEquivs(pGia,nConfs,fVerbose);
    Gia_ManStop(pGVar1);
    Gia_ManPrintStats(pGia,(Gps_Par_t *)0x0);
  }
  vClasses = Abc_NtkCollectEquivClasses(pNtks,pGia);
  Gia_ManStop(pGia);
  Abc_NtkDumpEquivFile(pFileName,vClasses,pNtks);
  if (vClasses->pArray != (int *)0x0) {
    free(vClasses->pArray);
    vClasses->pArray = (int *)0x0;
  }
  if (vClasses != (Vec_Int_t *)0x0) {
    free(vClasses);
    return;
  }
  return;
}

Assistant:

void Abc_NtkDumpEquiv( Abc_Ntk_t * pNtks[2], char * pFileName, int nConfs, int fByName, int fVerbose )
{
    //abctime clk = Abc_Clock();
    Gia_Man_t * pTemp;
    Vec_Int_t * vClasses;
    // derive shared AIG for the two networks
    Gia_Man_t * pGia = Abc_NtkAigToGiaTwo( pNtks[0], pNtks[1], fByName );
    if ( fVerbose )
        printf( "Computing equivalences for networks \"%s\" and \"%s\" with conflict limit %d.\n", Abc_NtkName(pNtks[0]), Abc_NtkName(pNtks[1]), nConfs );
    // compute equivalences in this AIG
    pTemp = Gia_ManComputeGiaEquivs( pGia, nConfs, fVerbose );
    Gia_ManStop( pTemp );
    //if ( fVerbose )
    //    Abc_PrintTime( 1, "Equivalence computation time", Abc_Clock() - clk );
    if ( fVerbose )
        Gia_ManPrintStats( pGia, NULL );
    // collect equivalence class information
    vClasses = Abc_NtkCollectEquivClasses( pNtks, pGia );
    Gia_ManStop( pGia );
    // dump information into the output file
    Abc_NtkDumpEquivFile( pFileName, vClasses, pNtks );
    Vec_IntFree( vClasses );
}